

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O1

void cpp_wrapper_range(planck_unit_test_t *tc,Dictionary<int,_int> *dict,int min_key,int max_key,
                      int *expected_records,int expected_num_records,ion_boolean_t records_exist)

{
  ulong uVar1;
  planck_unit_result_t pVar2;
  byte bVar3;
  ion_cursor_status_t iVar4;
  char cVar5;
  Cursor<int,_int> *this;
  ulong uVar6;
  int actual;
  long lVar7;
  ion_record_t *piVar8;
  ulong local_40;
  
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(min_key < max_key),0xa2,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') goto LAB_00101971;
  this = Dictionary<int,_int>::range(dict,min_key,max_key);
  bVar3 = this->cursor->status - 2;
  if (records_exist == '\0') {
    pVar2 = planck_unit_assert_true
                      (tc,(uint)((bVar3 & 0xfd) != 0),0xa7,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar2 == '\0') goto LAB_00101971;
    iVar4 = (*this->cursor->next)(this->cursor,&this->record);
    cVar5 = planck_unit_assert_true
                      (tc,(uint)((iVar4 - 2U & 0xfd) != 0),0xa8,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
  }
  else {
    pVar2 = planck_unit_assert_true
                      (tc,(uint)((bVar3 & 0xfd) == 0),0xaf,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was false, expected true");
    if (pVar2 == '\0') goto LAB_00101971;
    piVar8 = &this->record;
    iVar4 = (*this->cursor->next)(this->cursor,piVar8);
    if ((iVar4 == '\x04') || (actual = 0, iVar4 == '\x02')) {
      local_40 = 0;
      actual = 0;
      do {
        uVar1 = local_40;
        if (0 < expected_num_records) {
          uVar6 = 0;
          do {
            uVar1 = uVar6;
            if (expected_records[uVar6] == *piVar8->key) break;
            uVar6 = uVar6 + 1;
            uVar1 = local_40;
          } while ((uint)expected_num_records != uVar6);
        }
        local_40 = uVar1;
        lVar7 = (long)(int)local_40;
        pVar2 = planck_unit_assert_int_are_equal
                          (tc,expected_records[lVar7],*piVar8->key,0xbe,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                          );
        if ((pVar2 == '\0') ||
           (pVar2 = planck_unit_assert_int_are_equal
                              (tc,expected_records[lVar7],*(this->record).value,0xbf,
                               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                              ), pVar2 == '\0')) goto LAB_00101971;
        expected_records[lVar7] = 999;
        iVar4 = (*this->cursor->next)(this->cursor,piVar8);
        actual = actual + 1;
      } while ((iVar4 == '\x02') || (iVar4 == '\x04'));
    }
    pVar2 = planck_unit_assert_true
                      (tc,(uint)((this->cursor->status - 2U & 0xfd) != 0),199,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar2 == '\0') goto LAB_00101971;
    cVar5 = planck_unit_assert_int_are_equal
                      (tc,expected_num_records,actual,0xca,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                      );
  }
  if (cVar5 != '\0') {
    Cursor<int,_int>::~Cursor(this);
    operator_delete(this);
    return;
  }
LAB_00101971:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
cpp_wrapper_range(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int min_key,
	int max_key,
	int expected_records[],
	int expected_num_records,
	ion_boolean_t records_exist
) {
	PLANCK_UNIT_ASSERT_TRUE(tc, min_key < max_key);

	Cursor<int, int> *cursor = dict->range(min_key, max_key);

	if (!records_exist) {
		PLANCK_UNIT_ASSERT_FALSE(tc, cursor->hasNext());
		PLANCK_UNIT_ASSERT_FALSE(tc, cursor->next());

		delete cursor;

		return;
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, cursor->hasNext());

	int records_found			= 0;
	int curr_pos				= 0;

	ion_cursor_status_t status	= cursor->next();

	while (status) {
		for (int i = 0; i < expected_num_records; i++) {
			if (expected_records[i] == cursor->getKey()) {
				curr_pos = i;
				break;
			}
		}

		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_records[curr_pos], cursor->getKey());
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_records[curr_pos], cursor->getValue());

		expected_records[curr_pos]	= NULL_VALUE;
		status						= cursor->next();
		min_key++;
		records_found++;
	}

	PLANCK_UNIT_ASSERT_FALSE(tc, cursor->hasNext());

	/* Check that same number of records are found as were inserted with desired key. */
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_num_records, records_found);

	delete cursor;
}